

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_DACCtrl_Setup(VGMPlayer *this)

{
  pointer *ppDVar1;
  UINT8 UVar2;
  pointer pDVar3;
  iterator __position;
  UINT8 UVar4;
  UINT8 *pUVar5;
  CHIP_DEVICE *devInf;
  ulong uVar6;
  size_t sVar7;
  DACSTRM_DEV dacStrm;
  DEV_GEN_CFG devCfg;
  DACSTRM_DEV local_70;
  DEV_GEN_CFG local_38;
  
  pUVar5 = this->_fileData;
  uVar6 = (ulong)this->_filePos;
  sVar7 = this->_dacStrmMap[pUVar5[uVar6 + 1]];
  if (sVar7 == 0xffffffffffffffff) {
    if (pUVar5[uVar6 + 1] == 0xff) {
      return;
    }
    local_38.emuCore = 0;
    local_38.srMode = '\0';
    local_38.flags = '\0';
    local_38.clock = 0;
    local_38.smplRate = (this->super_PlayerBase)._outSmplRate;
    UVar4 = device_start_daccontrol(&local_38,&local_70.defInf);
    if (UVar4 != '\0') {
      return;
    }
    (*(local_70.defInf.devDef)->Reset)(local_70.defInf.dataPtr);
    local_70.streamID = this->_fileData[(ulong)this->_filePos + 1];
    local_70.bankID = 0xff;
    local_70.pbMode = '\0';
    local_70.freq = 0;
    local_70.lastItem = 0xffffffff;
    local_70.maxItems = 0;
    __position._M_current =
         (this->_dacStreams).
         super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl
         .super__Vector_impl_data._M_finish;
    this->_dacStrmMap[local_70.streamID] =
         ((long)__position._M_current -
          (long)(this->_dacStreams).
                super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    if (__position._M_current ==
        (this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VGMPlayer::DACSTRM_DEV,std::allocator<VGMPlayer::DACSTRM_DEV>>::
      _M_realloc_insert<VGMPlayer::DACSTRM_DEV_const&>
                ((vector<VGMPlayer::DACSTRM_DEV,std::allocator<VGMPlayer::DACSTRM_DEV>> *)
                 &this->_dacStreams,__position,&local_70);
    }
    else {
      (__position._M_current)->lastItem = 0xffffffff;
      (__position._M_current)->maxItems = 0;
      uVar6 = (ulong)CONCAT13(local_70._43_1_,CONCAT21(0xff,local_70.streamID));
      ((__position._M_current)->defInf).linkDevs = local_70.defInf.linkDevs;
      (__position._M_current)->streamID = (char)uVar6;
      (__position._M_current)->bankID = (char)(uVar6 >> 8);
      (__position._M_current)->pbMode = (char)(uVar6 >> 0x10);
      (__position._M_current)->field_0x2b = (char)(uVar6 >> 0x18);
      (__position._M_current)->freq = (int)(uVar6 >> 0x20);
      ((__position._M_current)->defInf).devDef = local_70.defInf.devDef;
      ((__position._M_current)->defInf).linkDevCount = local_70.defInf.linkDevCount;
      *(undefined4 *)&((__position._M_current)->defInf).field_0x1c = local_70.defInf._28_4_;
      ((__position._M_current)->defInf).dataPtr = local_70.defInf.dataPtr;
      ((__position._M_current)->defInf).sampleRate = local_70.defInf.sampleRate;
      *(undefined4 *)&((__position._M_current)->defInf).field_0xc = local_70.defInf._12_4_;
      ppDVar1 = &(this->_dacStreams).
                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    sVar7 = this->_dacStrmMap[local_70.streamID];
    pUVar5 = this->_fileData;
    uVar6 = (ulong)this->_filePos;
  }
  pDVar3 = (this->_dacStreams).
           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  UVar4 = pUVar5[uVar6 + 3];
  UVar2 = pUVar5[uVar6 + 4];
  devInf = GetDevicePtr(this,pUVar5[uVar6 + 2] & 0x7f,pUVar5[uVar6 + 2] >> 7);
  if (devInf != (CHIP_DEVICE *)0x0) {
    daccontrol_setup_chip
              (pDVar3[sVar7].defInf.dataPtr,(DEV_INFO *)devInf,devInf->chipType,
               CONCAT11(UVar4,UVar2));
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Setup(void)	// DAC Stream Control: Setup Chip
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
	{
		if (fData[0x01] == 0xFF)
			return;
		
		DEV_GEN_CFG devCfg;
		DACSTRM_DEV dacStrm;
		UINT8 retVal;
		
		devCfg.emuCore = 0x00;
		devCfg.srMode = DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 0;
		devCfg.smplRate = _outSmplRate;
		retVal = device_start_daccontrol(&devCfg, &dacStrm.defInf);
		if (retVal)
			return;
		dacStrm.defInf.devDef->Reset(dacStrm.defInf.dataPtr);
		dacStrm.streamID = fData[0x01];
		dacStrm.bankID = 0xFF;
		dacStrm.pbMode = 0x00;
		dacStrm.freq = 0;
		dacStrm.lastItem = (UINT32)-1;
		dacStrm.maxItems = 0;
		
		_dacStrmMap[dacStrm.streamID] = _dacStreams.size();
		_dacStreams.push_back(dacStrm);
		
		dsID = _dacStrmMap[dacStrm.streamID];
	}
	
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	UINT8 chipType = fData[0x02] & 0x7F;
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	UINT16 chipCmd = ReadBE16(&fData[0x03]);
	CHIP_DEVICE* destChip = GetDevicePtr(chipType, chipID);
	if (destChip == NULL)
		return;
	
	daccontrol_setup_chip(dacStrm->defInf.dataPtr, &destChip->base.defInf, destChip->chipType, chipCmd);
	return;
}